

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_iterator.cpp
# Opt level: O3

void __thiscall
QFSFileEngineIterator::QFSFileEngineIterator
          (QFSFileEngineIterator *this,QString *path,IteratorFlags filters,QStringList *filterNames)

{
  QFileSystemIterator *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractFileEngineIterator::QAbstractFileEngineIterator
            (&this->super_QAbstractFileEngineIterator,path,filters,filterNames);
  (this->super_QAbstractFileEngineIterator)._vptr_QAbstractFileEngineIterator =
       (_func_int **)&PTR__QFSFileEngineIterator_00188688;
  this_00 = (QFileSystemIterator *)operator_new(0x68);
  QFileSystemEntry::QFileSystemEntry(&local_68,path);
  QFileSystemIterator::QFileSystemIterator(this_00,&local_68,filters);
  (this->nativeIterator)._M_t.
  super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>._M_t.
  super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>.
  super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl = this_00;
  if (&(local_68.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFSFileEngineIterator::QFSFileEngineIterator(const QString &path, QDirListing::IteratorFlags filters,
                                             const QStringList &filterNames)
    : QAbstractFileEngineIterator(path, filters, filterNames),
      nativeIterator(new QFileSystemIterator(QFileSystemEntry(path), filters))
{
}